

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::DataSink::~DataSink(DataSink *this)

{
  DataSink *this_local;
  
  data_sink_streambuf::~data_sink_streambuf(&this->sb_);
  std::ostream::~ostream(&this->os);
  std::function<bool_()>::~function(&this->is_writable);
  std::function<void_()>::~function(&this->done);
  std::function<bool_(const_char_*,_unsigned_long)>::~function(&this->write);
  return;
}

Assistant:

DataSink() : os(&sb_), sb_(*this) {}